

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction_job.tpl.h
# Opt level: O0

bool __thiscall
r_exec::ReductionJob<r_exec::GTPX>::update(ReductionJob<r_exec::GTPX> *this,uint64_t now)

{
  _Mem *this_00;
  GTPX *this_01;
  View *input;
  uint64_t now_local;
  ReductionJob<r_exec::GTPX> *this_local;
  
  this_00 = _Mem::Get();
  _Mem::register_reduction_job_latency(this_00,now - (this->super__ReductionJob).ijt);
  this_01 = core::P<r_exec::GTPX>::operator->(&this->processor);
  input = core::P::operator_cast_to_View_((P *)&this->input);
  GTPX::reduce(this_01,input);
  return true;
}

Assistant:

bool ReductionJob<_P>::update(uint64_t now)
{
    _Mem::Get()->register_reduction_job_latency(now - ijt);
    processor->reduce(input);
    return true;
}